

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O3

Gia_Man_t * Gia_ManReadGig(char *pFileName)

{
  byte *__nptr;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  char *__s;
  char *pcVar7;
  Vec_Int_t *p;
  int *piVar8;
  Vec_Int_t *p_00;
  size_t sVar9;
  char cVar10;
  uint uVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pFileName_00;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  
  __s = Extra_FileReadContents(pFileName);
  if (__s == (char *)0x0) {
    printf("Cannot open input file %s\n",pFileName);
  }
  cVar10 = *__s;
  if (cVar10 == '\0') {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    pcVar7 = __s;
    do {
      pcVar7 = pcVar7 + 1;
      uVar12 = uVar12 + (cVar10 == '\n');
      cVar10 = *pcVar7;
    } while (cVar10 != '\0');
  }
  p = (Vec_Int_t *)malloc(0x10);
  uVar11 = uVar12;
  if (uVar12 - 1 < 0xf) {
    uVar11 = 0x10;
  }
  p->nSize = 0;
  p->nCap = uVar11;
  if (uVar11 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((ulong)uVar11 << 2);
  }
  p->pArray = piVar8;
  uVar11 = uVar12 * 10;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (uVar12 * 10 - 1 < 0xf) {
    uVar11 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar11;
  if (uVar11 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((ulong)uVar11 << 2);
  }
  p_00->pArray = piVar8;
  pcVar7 = strtok(__s," w(-,)]\r\t");
  pFileName_00 = extraout_RDX;
  do {
    if (pcVar7 == (char *)0x0) {
      if (__s != (char *)0x0) {
        free(__s);
        pFileName_00 = extraout_RDX_01;
      }
      Gia_ManBuildGig(p,p_00,pFileName_00);
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
      }
      free(p);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      return (Gia_Man_t *)0x0;
    }
    Vec_IntPush(p,p_00->nSize);
    if (9 < (byte)(*pcVar7 - 0x30U)) {
      __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                    ,0xe6,"Gia_Man_t *Gia_ManReadGig(char *)");
    }
    iVar5 = atoi(pcVar7);
    Vec_IntPush(p_00,iVar5);
    pcVar7 = strtok((char *)0x0," w(-,)]\r\t");
    if (*pcVar7 != '=') {
      __assert_fail("pToken[0] == \'=\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                    ,0xea,"Gia_Man_t *Gia_ManReadGig(char *)");
    }
    pcVar7 = strtok((char *)0x0," w(-,)]\r\t");
    sVar9 = strlen(pcVar7);
    cVar10 = pcVar7[sVar9 - 1];
    if (cVar10 == '\n') {
      pcVar7[sVar9 - 1] = '\0';
    }
    lVar13 = 1;
    while (iVar5 = strcmp(pcVar7,s_GigNames[lVar13]), iVar5 != 0) {
      lVar13 = lVar13 + 1;
      if (lVar13 == 10) {
        __assert_fail("Type < GIG_UNUSED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0xf6,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
    }
    iVar5 = (int)lVar13;
    Vec_IntPush(p_00,iVar5);
    if (cVar10 != '\n') {
      uVar12 = p_00->nSize;
      Vec_IntPush(p_00,0);
      pcVar7 = strtok((char *)0x0," w(-,)]\r\t");
      while( true ) {
        if (pcVar7 == (char *)0x0) {
          __assert_fail("pToken != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x106,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        cVar10 = *pcVar7;
        if (cVar10 == '\n') goto LAB_006b5f38;
        if (cVar10 == '[') break;
        if (9 < (byte)(cVar10 - 0x30U)) {
          __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x102,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        iVar6 = atoi(pcVar7);
        Vec_IntPush(p_00,iVar6);
        if (((int)uVar12 < 0) || (p_00->nSize <= (int)uVar12)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        p_00->pArray[uVar12] = p_00->pArray[uVar12] + 1;
        pcVar7 = strtok((char *)0x0," w(-,)]\r\t");
      }
      __nptr = (byte *)(pcVar7 + 1);
      if (iVar5 == 6) {
        iVar5 = atoi((char *)__nptr);
      }
      else {
        if (iVar5 != 5) {
          __assert_fail("Type == GIG_DELAY",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x117,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        sVar9 = strlen((char *)__nptr);
        if (sVar9 != 4) {
          __assert_fail("strlen(pToken) == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x10e,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        bVar1 = *__nptr;
        iVar5 = -0x30;
        iVar6 = -0x30;
        if ((((9 < (byte)(bVar1 - 0x30)) && (iVar6 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
            (iVar6 = -0x57, 5 < (byte)(bVar1 + 0x9f))) ||
           (((bVar2 = pcVar7[2], 9 < (byte)(bVar2 - 0x30) &&
             (iVar5 = -0x37, 5 < (byte)(bVar2 + 0xbf))) && (iVar5 = -0x57, 5 < (byte)(bVar2 + 0x9f))
            ))) {
LAB_006b60c3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x343,"int Abc_TtReadHexDigit(char)");
        }
        bVar3 = pcVar7[3];
        iVar14 = -0x30;
        iVar15 = -0x30;
        if ((((9 < (byte)(bVar3 - 0x30)) && (iVar15 = -0x37, 5 < (byte)(bVar3 + 0xbf))) &&
            (iVar15 = -0x57, 5 < (byte)(bVar3 + 0x9f))) ||
           (((bVar4 = pcVar7[4], 9 < (byte)(bVar4 - 0x30) &&
             (iVar14 = -0x37, 5 < (byte)(bVar4 + 0xbf))) &&
            (iVar14 = -0x57, 5 < (byte)(bVar4 + 0x9f))))) goto LAB_006b60c3;
        iVar5 = (iVar14 + (uint)bVar4) * 0x1000 +
                (iVar15 + (uint)bVar3) * 0x100 + (iVar5 + (uint)bVar2) * 0x10 + iVar6 + (uint)bVar1;
      }
      Vec_IntPush(p_00,iVar5);
      pcVar7 = strtok((char *)0x0," w(-,)]\r\t");
      if (*pcVar7 != '\n') {
        __assert_fail("pToken[0] == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x11c,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
    }
LAB_006b5f38:
    pcVar7 = strtok((char *)0x0," w(-,)]\r\t");
    pFileName_00 = extraout_RDX_00;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManReadGig( char * pFileName )
{
    Gia_Man_t * pNew;
    int Type, Offset, fEndOfLine, Digit, nObjs; 
    char * pChars  = " w(-,)]\r\t";
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pStart  = pBuffer, * pToken;
    Vec_Int_t * vObjs, * vStore;
    if ( pBuffer == NULL )
        printf( "Cannot open input file %s\n", pFileName );
    // count objects
    for ( nObjs = 0, pToken = pBuffer; *pToken; pToken++ )
        nObjs += (int)(*pToken == '\n');
    // read objects
    vObjs  = Vec_IntAlloc( nObjs );
    vStore = Vec_IntAlloc( 10*nObjs );
    while ( 1 )
    {
        // read net ID
        pToken = strtok( pStart, pChars );
        pStart = NULL;
        if ( pToken == NULL )
            break;
        // start new object
        Vec_IntPush( vObjs, Vec_IntSize(vStore) );
        // save net ID
        assert( pToken[0] >= '0' && pToken[0] <= '9' );
        Vec_IntPush( vStore, atoi(pToken) );
        // read equal
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '=' );
        // read type
        pToken = strtok( pStart, pChars );
        fEndOfLine = 0;
        if ( pToken[strlen(pToken)-1] == '\n' )
        {
            pToken[strlen(pToken)-1] = 0;
            fEndOfLine = 1;
        }
        for ( Type = GIG_RESET; Type < GIG_UNUSED; Type++ )
            if ( !strcmp(pToken, s_GigNames[Type]) )
                break;
        assert( Type < GIG_UNUSED );
        Vec_IntPush( vStore, Type );
        if ( fEndOfLine )
            continue;
        // read fanins
        Offset = Vec_IntSize(vStore);
        Vec_IntPush( vStore, 0 );
        while ( 1 )
        {
            pToken = strtok( pStart, pChars );
            if ( pToken == NULL || pToken[0] == '\n' || pToken[0] == '[' )
                break;
            assert( pToken[0] >= '0' && pToken[0] <= '9' );
            Vec_IntPush( vStore, atoi(pToken) );
            Vec_IntAddToEntry( vStore, Offset, 1 );
        }
        assert( pToken != NULL );
        if ( pToken[0] == '\n' )
            continue;
        assert( pToken[0] == '[' );
        // read attribute
        pToken++;
        if ( Type == GIG_LUT )
        {
            assert( strlen(pToken) == 4 );
            Digit  = Abc_TtReadHexDigit(pToken[0]);
            Digit |= Abc_TtReadHexDigit(pToken[1]) << 4;
            Digit |= Abc_TtReadHexDigit(pToken[2]) << 8;
            Digit |= Abc_TtReadHexDigit(pToken[3]) << 12;
            Vec_IntPush( vStore, Digit );
        }
        else
        {
            assert( Type == GIG_DELAY );
            Vec_IntPush( vStore, atoi(pToken) );
        }
        // read end of line
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '\n' );
    }
    ABC_FREE( pBuffer );
    // create AIG
    pNew = Gia_ManBuildGig( vObjs, vStore, pFileName );
    // cleanup
    Vec_IntFree( vObjs );
    Vec_IntFree( vStore );
    return pNew;
}